

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

int secp256k1_ge_is_valid_var(secp256k1_ge *a)

{
  int iVar1;
  secp256k1_fe x3;
  secp256k1_fe y2;
  secp256k1_fe local_90;
  secp256k1_fe local_68;
  secp256k1_fe local_40;
  
  if (a->infinity != 0) {
    return 0;
  }
  secp256k1_fe_sqr(&local_68,&a->y);
  secp256k1_fe_sqr(&local_90,&a->x);
  secp256k1_fe_mul(&local_90,&local_90,&a->x);
  local_90.n[0] = local_90.n[0] + (local_90.n[4] >> 0x30) * 0x1000003d1 + 7;
  local_90.n[1] = (local_90.n[0] >> 0x34) + local_90.n[1];
  local_90.n[0] = local_90.n[0] & 0xfffffffffffff;
  local_90.n[2] = (local_90.n[1] >> 0x34) + local_90.n[2];
  local_90.n[1] = local_90.n[1] & 0xfffffffffffff;
  local_90.n[3] = (local_90.n[2] >> 0x34) + local_90.n[3];
  local_90.n[2] = local_90.n[2] & 0xfffffffffffff;
  local_90.n[4] = (local_90.n[3] >> 0x34) + (local_90.n[4] & 0xffffffffffff);
  local_90.n[3] = local_90.n[3] & 0xfffffffffffff;
  local_40.n[0] = (0x3ffffbfffff0bc - local_68.n[0]) + local_90.n[0];
  local_40.n[1] = (0x3ffffffffffffc - local_68.n[1]) + local_90.n[1];
  local_40.n[2] = (0x3ffffffffffffc - local_68.n[2]) + local_90.n[2];
  local_40.n[3] = (0x3ffffffffffffc - local_68.n[3]) + local_90.n[3];
  local_40.n[4] = (local_90.n[4] - local_68.n[4]) + 0x3fffffffffffc;
  iVar1 = secp256k1_fe_normalizes_to_zero_var(&local_40);
  return iVar1;
}

Assistant:

static int secp256k1_ge_is_valid_var(const secp256k1_ge *a) {
    secp256k1_fe y2, x3, c;
    if (a->infinity) {
        return 0;
    }
    /* y^2 = x^3 + 7 */
    secp256k1_fe_sqr(&y2, &a->y);
    secp256k1_fe_sqr(&x3, &a->x); secp256k1_fe_mul(&x3, &x3, &a->x);
    secp256k1_fe_set_int(&c, CURVE_B);
    secp256k1_fe_add(&x3, &c);
    secp256k1_fe_normalize_weak(&x3);
    return secp256k1_fe_equal_var(&y2, &x3);
}